

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O2

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::TabletEvent,QWindow*,unsigned_long,QPointF,QPointF,QPointingDevice_const*,QFlags<Qt::MouseButton>,double,double,double,double,double,int,QFlags<Qt::KeyboardModifier>>
               (QWindow *args,unsigned_long args_1,QPointF args_2,QPointF args_3,
               QPointingDevice *args_4,QFlags<Qt::MouseButton> args_5,double args_6,double args_7,
               double args_8,double args_9,double args_10,int args_11,
               QFlags<Qt::KeyboardModifier> args_12)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined1 uVar4;
  long in_FS_OFFSET;
  TabletEvent event;
  QPointF local_f0;
  QPointF local_e0;
  TabletEvent local_d0;
  long local_38;
  
  local_e0.yp = args_2.yp;
  local_f0.yp = args_3.yp;
  local_f0.xp = args_3.xp;
  local_e0.xp = args_2.xp;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QThread::isMainThread();
  if (cVar1 == '\0') {
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::TabletEvent,QWindow*,unsigned_long,QPointF,QPointF,QPointingDevice_const*,QFlags<Qt::MouseButton>,double,double,double,double,double,int,QFlags<Qt::KeyboardModifier>>
              (args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,args_8,args_9,args_10,args_11,
               args_12);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      bVar2 = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
      return bVar2;
    }
  }
  else {
    memcpy(&local_d0,&DAT_005de108,0x98);
    QWindowSystemInterfacePrivate::TabletEvent::TabletEvent
              (&local_d0,args,args_1,&local_e0,&local_f0,args_4,
               (MouseButtons)
               args_5.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
               super_QFlagsStorage<Qt::MouseButton>.i,args_6,args_7,args_8,args_9,args_10,args_11,
               (KeyboardModifiers)
               args_12.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
               super_QFlagsStorage<Qt::KeyboardModifier>.i);
    if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
      QGuiApplicationPrivate::processWindowSystemEvent((WindowSystemEvent *)&local_d0);
      uVar4 = local_d0.super_PointerEvent.super_InputEvent.super_UserEvent.super_WindowSystemEvent.
              eventAccepted;
    }
    else {
      iVar3 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                        (QWindowSystemInterfacePrivate::eventHandler,&local_d0);
      uVar4 = local_d0.super_PointerEvent.super_InputEvent.super_UserEvent.super_WindowSystemEvent.
              eventAccepted;
      if ((char)iVar3 == '\0') {
        uVar4 = 0;
      }
    }
    QWindowSystemInterfacePrivate::UserEvent::~UserEvent((UserEvent *)&local_d0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (bool)uVar4;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}